

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

size_t dlbulk_free(void **array,size_t nelem)

{
  mstate m;
  byte *pbVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  mchunkptr p;
  long lVar7;
  size_t psize;
  
  iVar3 = _gm_.mutex;
  p = (mchunkptr)nelem;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar6 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar3 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar6 & 0x3f) == 0) {
          sched_yield();
        }
        uVar6 = uVar6 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  if (nelem != 0) {
    lVar7 = 0;
    do {
      lVar2 = *(long *)((long)array + lVar7);
      if (lVar2 != 0) {
        m = (mstate)(lVar2 + -0x10);
        uVar5 = *(ulong *)(lVar2 + -8);
        *(undefined8 *)((long)array + lVar7) = 0;
        if (m < _gm_.least_addr) {
LAB_0010afdd:
          abort();
        }
        uVar6 = (uint)uVar5;
        uVar4 = uVar6 & 3;
        psize = (size_t)uVar4;
        if (uVar4 == 1) goto LAB_0010afdd;
        p = (mchunkptr)(uVar5 & 0xfffffffffffffff8);
        if ((nelem * 8 + -8 == lVar7) ||
           (psize = (long)&p->prev_foot + (long)(m->smallbins + -7),
           *(size_t *)((long)array + lVar7 + 8) != psize)) {
          dispose_chunk(m,p,psize);
        }
        else {
          uVar5 = *(ulong *)(lVar2 + -8 + (long)p) & 0xfffffffffffffff8;
          *(ulong *)(lVar2 + -8) = (long)&p->prev_foot + (uVar6 & 1) + uVar5 + 2;
          pbVar1 = (byte *)((long)p + lVar2 + -8 + uVar5);
          *pbVar1 = *pbVar1 | 1;
          *(long *)((long)array + lVar7 + 8) = lVar2;
        }
      }
      lVar7 = lVar7 + 8;
    } while (nelem << 3 != lVar7);
  }
  if (_gm_.trim_check < _gm_.topsize) {
    sys_trim((mstate)0x0,(size_t)p);
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return 0;
}

Assistant:

size_t dlbulk_free(void* array[], size_t nelem) {
  return internal_bulk_free(gm, array, nelem);
}